

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContinuumPlasticVonMises::ArchiveOUT
          (ChContinuumPlasticVonMises *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChContinuumPlasticVonMises>(marchive);
  ChContinuumElastoplastic::ArchiveOUT(&this->super_ChContinuumElastoplastic,marchive);
  local_30._value = &this->elastic_yeld;
  local_30._name = "this->elastic_yeld";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->plastic_yeld;
  local_48._name = "this->plastic_yeld";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->flow_rate;
  local_60._name = "this->flow_rate";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChContinuumPlasticVonMises::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChContinuumPlasticVonMises>();
    // serialize parent class
    ChContinuumElastoplastic::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(this->elastic_yeld);
    marchive << CHNVP(this->plastic_yeld);
    marchive << CHNVP(this->flow_rate);
}